

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

XmlNodePtr __thiscall libcellml::mathmlChildNode(libcellml *this,XmlNodePtr *node,size_t index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  XmlNode XVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  size_t sVar5;
  XmlNodePtr XVar6;
  XmlNode local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  XmlNode::firstChild((XmlNode *)this);
  bVar3 = XmlNode::isMathmlElement(*(XmlNode **)this,(char *)0x0);
  sVar5 = (ulong)bVar3 - 1;
  _Var4._M_pi = extraout_RDX;
  if (sVar5 != index && *(long *)this != 0) {
    do {
      XVar6 = XmlNode::next(&local_38);
      p_Var2 = p_Stack_30;
      XVar1.mPimpl = local_38.mPimpl;
      _Var4 = XVar6.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      local_38.mPimpl = (XmlNodeImpl *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
      *(XmlNodeImpl **)this = XVar1.mPimpl;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var4._M_pi = extraout_RDX_00;
      }
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
        _Var4._M_pi = extraout_RDX_01;
      }
      if (*(XmlNode **)this != (XmlNode *)0x0) {
        bVar3 = XmlNode::isMathmlElement(*(XmlNode **)this,(char *)0x0);
        sVar5 = sVar5 + bVar3;
        _Var4._M_pi = extraout_RDX_02;
      }
    } while ((*(long *)this != 0) && (sVar5 != index));
  }
  XVar6.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  XVar6.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlNodePtr)XVar6.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr mathmlChildNode(const XmlNodePtr &node, size_t index)
{
    auto res = node->firstChild();
    auto childNodeIndex = res->isMathmlElement() ? 0 : MAX_SIZE_T;

    while ((res != nullptr) && (childNodeIndex != index)) {
        res = res->next();

        if ((res != nullptr) && res->isMathmlElement()) {
            ++childNodeIndex;
        }
    }

    return res;
}